

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O0

void __thiscall indk::Neuron::doFinalizeInput(Neuron *this,float P)

{
  long lVar1;
  float P_local;
  Neuron *this_local;
  memory_order __b;
  memory_order __b_1;
  
  if (this->OutputSignalSize <= this->OutputSignalPointer) {
    this->OutputSignalPointer = 0;
  }
  this->OutputSignal[this->OutputSignalPointer] = P;
  this->OutputSignalPointer = this->OutputSignalPointer + 1;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  lVar1 = (this->t).super___atomic_base<long>._M_i;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->t).super___atomic_base<long>._M_i = lVar1 + 1;
  UNLOCK();
  return;
}

Assistant:

void indk::Neuron::doFinalizeInput(float P) {
    if (OutputSignalPointer >= OutputSignalSize) OutputSignalPointer = 0;
    OutputSignal[OutputSignalPointer] = P;
    OutputSignalPointer++;
    t.store(t.load()+1);
//    std::cout << "Object processed " << Name << std::endl;
}